

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

internal_node<char,_false> *
immutable::rrb_details::internal_node_copy<char,false>
          (internal_node<char,_false> *original,uint32_t start,uint32_t len)

{
  internal_node<char,_false> *piVar1;
  uint local_24;
  uint32_t i;
  internal_node<char,_false> *node;
  uint32_t len_local;
  uint32_t start_local;
  internal_node<char,_false> *original_local;
  
  piVar1 = internal_node_create<char,false>(len);
  for (local_24 = 0; local_24 < len; local_24 = local_24 + 1) {
    ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
              (piVar1->child + local_24,original->child + (local_24 + start));
  }
  return piVar1;
}

Assistant:

inline internal_node<T, atomic_ref_counting>* internal_node_copy(const internal_node<T, atomic_ref_counting>* original, uint32_t start, uint32_t len)
      {
      internal_node<T, atomic_ref_counting>* node = internal_node_create<T, atomic_ref_counting>(len);
      for (uint32_t i = 0; i < len; ++i)
        node->child[i] = original->child[i + start];
      return node;
      }